

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer_on_shmem.cpp
# Opt level: O3

int64_t __thiscall SharedMemRingBuffer::GetMinIndexOfConsumers(SharedMemRingBuffer *this)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  int64_t iVar6;
  long lVar7;
  
  if (0 < (this->ring_buffer_status_on_shared_mem_->registered_consumer_count).
          super___atomic_base<int>._M_i) {
    lVar7 = 0x7fffffffffffffff;
    lVar5 = 0;
    bVar4 = 0;
    do {
      bVar3 = bVar4;
      lVar1 = this->ring_buffer_status_on_shared_mem_->array_consumer_indexes[lVar5].
              super___atomic_base<long>._M_i;
      bVar2 = lVar1 < lVar7;
      if (lVar1 < lVar7) {
        lVar7 = lVar1;
      }
      lVar5 = lVar5 + 1;
      bVar4 = bVar3 | bVar2;
    } while (lVar5 < (this->ring_buffer_status_on_shared_mem_->registered_consumer_count).
                     super___atomic_base<int>._M_i);
    iVar6 = 0;
    if ((bool)(bVar3 | bVar2)) {
      iVar6 = lVar7;
    }
    return iVar6;
  }
  return 0;
}

Assistant:

int64_t SharedMemRingBuffer::GetMinIndexOfConsumers()
{
    int64_t min_index = INT64_MAX ;
    bool is_found = false;
    for(int i = 0; i < ring_buffer_status_on_shared_mem_->registered_consumer_count; i++) {
        int64_t nIndex = ring_buffer_status_on_shared_mem_->array_consumer_indexes[i];
        if( nIndex < min_index ) {
            min_index = nIndex;
            is_found = true;
        }
    }
    if(!is_found) {
        return 0;
    }
    return min_index ;
}